

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool httplib::detail::is_socket_alive(socket_t sock)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  ssize_t sVar4;
  char buf [1];
  timeval local_b8;
  fd_set local_a8;
  
  iVar2 = 1;
  if (sock < 0x400) {
    local_a8.fds_bits[0xe] = 0;
    local_a8.fds_bits[0xf] = 0;
    local_a8.fds_bits[0xc] = 0;
    local_a8.fds_bits[0xd] = 0;
    local_a8.fds_bits[10] = 0;
    local_a8.fds_bits[0xb] = 0;
    local_a8.fds_bits[8] = 0;
    local_a8.fds_bits[9] = 0;
    local_a8.fds_bits[6] = 0;
    local_a8.fds_bits[7] = 0;
    local_a8.fds_bits[4] = 0;
    local_a8.fds_bits[5] = 0;
    local_a8.fds_bits[2] = 0;
    local_a8.fds_bits[3] = 0;
    local_a8.fds_bits[0] = 0;
    local_a8.fds_bits[1] = 0;
    iVar2 = sock + 0x3f;
    if (-1 < sock) {
      iVar2 = sock;
    }
    local_a8.fds_bits[iVar2 >> 6] =
         local_a8.fds_bits[iVar2 >> 6] | 1L << ((byte)(sock % 0x40) & 0x3f);
    local_b8.tv_sec = 0;
    local_b8.tv_usec = 0;
    do {
      iVar2 = select(sock + 1,&local_a8,(fd_set *)0x0,(fd_set *)0x0,&local_b8);
      if (-1 < iVar2) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
  }
  if (iVar2 == 0) {
    bVar1 = true;
  }
  else if ((iVar2 < 0) && (piVar3 = __errno_location(), *piVar3 == 9)) {
    bVar1 = false;
  }
  else {
    do {
      sVar4 = recv(sock,&local_a8,1,2);
      if (-1 < sVar4) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    bVar1 = 0 < sVar4;
  }
  return bVar1;
}

Assistant:

inline bool is_socket_alive(socket_t sock) {
  const auto val = detail::select_read(sock, 0, 0);
  if (val == 0) {
    return true;
  } else if (val < 0 && errno == EBADF) {
    return false;
  }
  char buf[1];
  return detail::read_socket(sock, &buf[0], sizeof(buf), MSG_PEEK) > 0;
}